

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O1

void __thiscall coins_tests::ccoins_add::test_method(ccoins_add *this)

{
  long lVar1;
  long in_FS_OFFSET;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-2,300,0xffffffff,'\x03','\0',
                     SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-2,300,0xffffffff,'\x01','\x01',
                     SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-1,300,0,'\x03','\0',SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-1,300,0,'\x01','\x01',SUB81(lVar2,0)
                    );
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-1,300,2,'\x03','\0',SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-1,300,2,'\x03','\x01',SUB81(lVar2,0)
                    );
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-1,300,1,'\x01','\0',SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-1,300,1,'\x01','\x01',SUB81(lVar2,0)
                    );
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-1,300,3,'\x03','\0',SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),-1,300,3,'\x03','\x01',SUB81(lVar2,0)
                    );
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),200,-3,0,-1,'\0',SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),200,300,0,'\x01','\x01',
                     SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),200,-3,2,-1,'\0',SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),200,300,2,'\x03','\x01',
                     SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),200,-3,1,-1,'\0',SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),200,300,1,'\x01','\x01',
                     SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),200,-3,3,-1,'\0',SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  lVar1 = 0;
  do {
    CheckAddCoinBase(*(CAmount *)((long)&DAT_00e6d7d0 + lVar1),200,300,3,'\x03','\x01',
                     SUB81(lVar2,0));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckAddCoin(Args&&... args)
{
    for (const CAmount base_value : {ABSENT, SPENT, VALUE1})
        CheckAddCoinBase(base_value, std::forward<Args>(args)...);
}